

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::parse_multipart_formdata(string *boundary,string *body,MultipartFiles *files)

{
  MultipartFiles *pMVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  const_reference pvVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8 [32];
  string_type local_188;
  string_type local_168;
  string_type local_148;
  undefined1 local_128 [8];
  smatch m;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> header;
  MultipartFile file;
  string name;
  size_type next_pos;
  ulong local_68;
  size_type pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> dash_boundary;
  allocator local_29;
  multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>
  *local_28;
  MultipartFiles *files_local;
  string *body_local;
  string *boundary_local;
  
  local_28 = (multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>
              *)files;
  files_local = (MultipartFiles *)body;
  body_local = boundary;
  if ((parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
       ::dash_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                   ::dash_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                ::dash_abi_cxx11_,"--",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    __cxa_atexit(std::__cxx11::string::~string,
                 &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                  ::dash_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                         ::dash_abi_cxx11_);
  }
  if ((parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
       ::crlf_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                   ::crlf_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                ::crlf_abi_cxx11_,"\r\n",(allocator *)(dash_boundary.field_2._M_local_buf + 0xb));
    std::allocator<char>::~allocator((allocator<char> *)(dash_boundary.field_2._M_local_buf + 0xb));
    __cxa_atexit(std::__cxx11::string::~string,
                 &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                  ::crlf_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                         ::crlf_abi_cxx11_);
  }
  if ((parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
       ::re_content_type_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                   ::re_content_type_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                ::re_content_type_abi_cxx11_,"Content-Type: (.*?)",1);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                  ::re_content_type_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                         ::re_content_type_abi_cxx11_);
  }
  if ((parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
       ::re_content_disposition_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                   ::re_content_disposition_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                ::re_content_disposition_abi_cxx11_,
               "Content-Disposition: form-data; name=\"(.*?)\"(?:; filename=\"(.*?)\")?",1);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                  ::re_content_disposition_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                         ::re_content_disposition_abi_cxx11_);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos,
                 &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                  ::dash_abi_cxx11_,body_local);
  lVar4 = std::__cxx11::string::find((string *)files_local,(ulong)&pos);
  if (lVar4 == 0) {
    std::__cxx11::string::size();
    lVar4 = std::__cxx11::string::find
                      ((string *)files_local,
                       (ulong)&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                               ::crlf_abi_cxx11_);
    if (lVar4 == -1) {
      boundary_local._7_1_ = 0;
    }
    else {
      lVar5 = std::__cxx11::string::size();
      local_68 = lVar4 + lVar5;
      do {
        uVar6 = std::__cxx11::string::size();
        if (uVar6 <= local_68) {
          boundary_local._7_1_ = 1;
          break;
        }
        name.field_2._8_8_ =
             std::__cxx11::string::find
                       ((string *)files_local,
                        (ulong)&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                ::crlf_abi_cxx11_);
        if (name.field_2._8_8_ == -1) {
          boundary_local._7_1_ = 0;
          break;
        }
        std::__cxx11::string::string((string *)&file.length);
        MultipartFile::MultipartFile((MultipartFile *)((long)&header.field_2 + 8));
        std::__cxx11::string::substr((ulong)&m._M_begin,(ulong)files_local);
        do {
          if (local_68 == name.field_2._8_8_) {
            lVar4 = std::__cxx11::string::size();
            pMVar1 = files_local;
            local_68 = name.field_2._8_8_ + lVar4;
            std::operator+(&local_1c8,
                           &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                            ::crlf_abi_cxx11_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos
                          );
            lVar4 = std::__cxx11::string::find((string *)pMVar1,(ulong)&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            if (lVar4 == -1) {
              boundary_local._7_1_ = 0;
              bVar2 = true;
            }
            else {
              file.offset = lVar4 - local_68;
              file.content_type.field_2._8_8_ = local_68;
              lVar5 = std::__cxx11::string::size();
              lVar8 = std::__cxx11::string::size();
              local_68 = lVar4 + lVar5 + lVar8;
              lVar4 = std::__cxx11::string::find
                                ((string *)files_local,
                                 (ulong)&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                         ::crlf_abi_cxx11_);
              if (lVar4 == -1) {
                boundary_local._7_1_ = 0;
                bVar2 = true;
              }
              else {
                std::
                multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>
                ::emplace<std::__cxx11::string&,httplib::MultipartFile&>
                          (local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&file.length,(MultipartFile *)((long)&header.field_2 + 8));
                lVar5 = std::__cxx11::string::size();
                local_68 = lVar4 + lVar5;
                bVar2 = false;
              }
            }
            break;
          }
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_128);
          bVar2 = std::
                  regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &m._M_begin,
                             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)local_128,
                             &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                              ::re_content_type_abi_cxx11_,0);
          if (bVar2) {
            pvVar7 = std::__cxx11::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_128,1);
            std::__cxx11::sub_match::operator_cast_to_string(&local_148,(sub_match *)pvVar7);
            std::__cxx11::string::operator=
                      ((string *)(file.filename.field_2._M_local_buf + 8),(string *)&local_148);
            std::__cxx11::string::~string((string *)&local_148);
          }
          else {
            bVar2 = std::
                    regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &m._M_begin,
                               (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)local_128,
                               &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                ::re_content_disposition_abi_cxx11_,0);
            if (bVar2) {
              pvVar7 = std::__cxx11::
                       match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)local_128,1);
              std::__cxx11::sub_match::operator_cast_to_string(&local_168,(sub_match *)pvVar7);
              std::__cxx11::string::operator=((string *)&file.length,(string *)&local_168);
              std::__cxx11::string::~string((string *)&local_168);
              pvVar7 = std::__cxx11::
                       match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)local_128,2);
              std::__cxx11::sub_match::operator_cast_to_string(&local_188,(sub_match *)pvVar7);
              std::__cxx11::string::operator=
                        ((string *)(header.field_2._M_local_buf + 8),(string *)&local_188);
              std::__cxx11::string::~string((string *)&local_188);
            }
          }
          lVar4 = std::__cxx11::string::size();
          local_68 = name.field_2._8_8_ + lVar4;
          name.field_2._8_8_ =
               std::__cxx11::string::find
                         ((string *)files_local,
                          (ulong)&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                  ::crlf_abi_cxx11_);
          if (name.field_2._8_8_ != -1) {
            std::__cxx11::string::substr((ulong)local_1a8,(ulong)files_local);
            std::__cxx11::string::operator=((string *)&m._M_begin,local_1a8);
            std::__cxx11::string::~string(local_1a8);
          }
          else {
            boundary_local._7_1_ = 0;
          }
          bVar2 = name.field_2._8_8_ == -1;
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_128);
        } while (!bVar2);
        std::__cxx11::string::~string((string *)&m._M_begin);
        MultipartFile::~MultipartFile((MultipartFile *)((long)&header.field_2 + 8));
        std::__cxx11::string::~string((string *)&file.length);
      } while (!bVar2);
    }
  }
  else {
    boundary_local._7_1_ = 0;
  }
  std::__cxx11::string::~string((string *)&pos);
  return (bool)(boundary_local._7_1_ & 1);
}

Assistant:

inline bool parse_multipart_formdata(
    const std::string& boundary, const std::string& body, MultipartFiles& files)
{
    static std::string dash = "--";
    static std::string crlf = "\r\n";

    static std::regex re_content_type(
        "Content-Type: (.*?)", std::regex_constants::icase);

    static std::regex re_content_disposition(
        "Content-Disposition: form-data; name=\"(.*?)\"(?:; filename=\"(.*?)\")?",
        std::regex_constants::icase);

    auto dash_boundary = dash + boundary;

    auto pos = body.find(dash_boundary);
    if (pos != 0) {
        return false;
    }

    pos += dash_boundary.size();

    auto next_pos = body.find(crlf, pos);
    if (next_pos == std::string::npos) {
        return false;
    }

    pos = next_pos + crlf.size();

    while (pos < body.size()) {
        next_pos = body.find(crlf, pos);
        if (next_pos == std::string::npos) {
            return false;
        }

        std::string name;
        MultipartFile file;

        auto header = body.substr(pos, (next_pos - pos));

        while (pos != next_pos) {
            std::smatch m;
            if (std::regex_match(header, m, re_content_type)) {
                file.content_type = m[1];
            } else if (std::regex_match(header, m, re_content_disposition)) {
                name = m[1];
                file.filename = m[2];
            }

            pos = next_pos + crlf.size();

            next_pos = body.find(crlf, pos);
            if (next_pos == std::string::npos) {
                return false;
            }

            header = body.substr(pos, (next_pos - pos));
        }

        pos = next_pos + crlf.size();

        next_pos = body.find(crlf + dash_boundary, pos);

        if (next_pos == std::string::npos) {
            return false;
        }

        file.offset = pos;
        file.length = next_pos - pos;

        pos = next_pos + crlf.size() + dash_boundary.size();

        next_pos = body.find(crlf, pos);
        if (next_pos == std::string::npos) {
            return false;
        }

        files.emplace(name, file);

        pos = next_pos + crlf.size();
    }

    return true;
}